

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalability_test.c
# Opt level: O1

void serve(void *arg)

{
  int iVar1;
  nng_msg *local_18;
  nng_msg *msg;
  
  do {
    local_18 = (nng_msg *)0x0;
    iVar1 = nng_recvmsg(rep,&local_18,0);
    if (iVar1 != 0) break;
    iVar1 = nng_sendmsg(rep,local_18,0);
  } while (iVar1 == 0);
  if (local_18 != (nng_msg *)0x0) {
    nng_msg_free(local_18);
  }
  nng_socket_close(rep);
  return;
}

Assistant:

void
serve(void *arg)
{
	nng_msg *msg;
	(void) arg; // unused

	for (;;) {
		msg = NULL;
		if ((nng_recvmsg(rep, &msg, 0) != 0) ||
		    (nng_sendmsg(rep, msg, 0) != 0)) {
			break;
		}
	}
	if (msg != NULL) {
		nng_msg_free(msg);
	}
	nng_socket_close(rep);
}